

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iuutil::CmpHelperNeRange<int[5],int[5]>
          (AssertionResult *__return_storage_ptr__,iuutil *this,char *expected_expr,
          char *actual_expr,int (*expected) [5],int (*actual) [5])

{
  AssertionResult *pAVar1;
  AssertionResult ar;
  char *local_98;
  iuutil *local_90;
  string local_88;
  AssertionResult local_68;
  AssertionResult local_40;
  
  local_98 = expected_expr;
  local_90 = this;
  CmpHelperNeIterator<int_const*,int_const*>
            (&local_40,(iuutil *)actual_expr,(int *)(actual_expr + 0x14),*expected,expected[1],
             *actual);
  if (local_40.m_result == true) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    local_68.m_message._M_dataplus._M_p = (pointer)&local_68.m_message.field_2;
    local_68.m_message._M_string_length = 0;
    local_68.m_message.field_2._M_local_buf[0] = '\0';
    local_68.m_result = false;
    pAVar1 = iutest::AssertionResult::operator<<(&local_68,(char (*) [18])"error: Expected: ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char **)&local_90);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [5])" != ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_98);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [12])" \n  Actual:");
    iutest::PrintToString<int[5]>(&local_88,(int (*) [5])actual_expr);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_88);
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNeRange(const char* expected_expr, const char* actual_expr
    , const T1& expected, const T2& actual)
{
    IUTEST_USING_BEGIN_END();
    if( ::iutest::AssertionResult ar =
        CmpHelperNeIterator(begin(expected), end(expected), begin(actual), end(actual)))
    {
        return ::iutest::AssertionSuccess();
    }
    else
    {
        return ::iutest::AssertionFailure() << "error: Expected: " << expected_expr << " != " << actual_expr
            << " \n  Actual:" << ::iutest::internal::FormatForComparisonFailureMessage(expected, actual);
    }
}